

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

Ptr __thiscall
TgBot::Api::sendVideoNote
          (Api *this,Api *chatId,int64_t videoNote,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *replyToMessageId,long param_5,undefined1 param_6,int length,int param_8,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_9,Ptr *param_10)

{
  __shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  type pbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  bool disableNotification_local;
  allocator local_99;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  shared_ptr<TgBot::InputFile> file;
  int64_t replyToMessageId_local;
  int64_t chatId_local;
  string local_40;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  disableNotification_local = (bool)param_6;
  replyToMessageId_local = param_5;
  chatId_local = videoNote;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,8);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])0x27334a,&chatId_local);
  if (*(int *)replyToMessageId >> 0x1f == *(int *)replyToMessageId) {
    p_Var1 = &boost::
              relaxed_get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                        (replyToMessageId)->
              super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>,p_Var1);
    local_40._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [11])"video_note",
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data
               ,(bool *)&local_40,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mimeType,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                fileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pbVar2 = boost::
             relaxed_get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       (replyToMessageId);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [11])"video_note",pbVar2);
  }
  if (disableNotification_local == true) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [21])"disable_notification",&disableNotification_local);
  }
  if (length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[9],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [9])0x2736be,&length);
  }
  if (param_8 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [7])"length",&param_8);
  }
  if (*(int *)param_9 >> 0x1f == *(int *)param_9) {
    p_Var1 = &boost::
              relaxed_get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                        (param_9)->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>,p_Var1);
    local_40._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [6])"thumb",
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data
               ,(bool *)&local_40,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mimeType,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                fileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pbVar2 = boost::
             relaxed_get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       (param_9);
    std::__cxx11::string::string((string *)&file,(string *)pbVar2);
    if (file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
      emplace_back<char_const(&)[6],std::__cxx11::string&>
                ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
                 (char (*) [6])"thumb",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if ((param_10->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    TgTypeParser::parseGenericReply_abi_cxx11_
              ((string *)&file,(TgTypeParser *)&chatId->field_0x28,param_10);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [13])"reply_markup",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  if (param_5 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],long&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [20])"reply_to_message_id",&replyToMessageId_local);
  }
  std::__cxx11::string::string((string *)&local_40,"sendVideoNote",&local_99);
  sendRequest((ptree *)&file,chatId,&local_40,&args);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)&chatId->field_0x28);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&file);
  std::__cxx11::string::~string((string *)&local_40);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  PVar3.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar3.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendVideoNote(int64_t chatId, const boost::variant<InputFile::Ptr, std::string> videoNote, int64_t replyToMessageId, bool disableNotification, int32_t duration, int32_t length, const boost::variant<InputFile::Ptr, std::string> thumb, const GenericReply::Ptr replyMarkup) const {
    vector<HttpReqArg> args;
    args.reserve(8);
    args.emplace_back("chat_id", chatId);
    if (videoNote.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(videoNote);
        args.emplace_back("video_note", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        args.emplace_back("video_note", boost::get<std::string>(videoNote));
    }
    if (disableNotification) {
        args.emplace_back("disable_notification", disableNotification);
    }
    if (duration) {
        args.emplace_back("duration", duration);
    }
    if (length) {
        args.emplace_back("length", length);
    }
    if (thumb.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(thumb);
        args.emplace_back("thumb", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        auto thumbStr = boost::get<std::string>(thumb);
        if (!thumbStr.empty()) {
            args.emplace_back("thumb", thumbStr);
        }
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendVideoNote", args));
}